

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O2

void __thiscall
commodities_customShort_Test::~commodities_customShort_Test(commodities_customShort_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, customShort)
{
    disableCustomCommodities();
    auto c = getCommodity("QQQQ");
    auto ss = getCommodityName(c);
    EXPECT_EQ(ss, "qqqq");

    c = getCommodity("a");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "a");

    c = getCommodity("bb");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "bb");

    c = getCommodity("ccc");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "ccc");

    c = getCommodity("ddddd");
    ss = getCommodityName(c);
    EXPECT_EQ(ss, "ddddd");

    // this one should fail
    c = getCommodity("eeeeee");
    ss = getCommodityName(c);
    EXPECT_NE(ss, "eeeeee");
    enableCustomCommodities();
}